

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

CRuleSet * __thiscall
allocator_default<CDoodadsMapper::CRuleSet>::alloc_array
          (allocator_default<CDoodadsMapper::CRuleSet> *this,int size)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this_00;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(int)this;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x90),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0x90),0) | 8;
  }
  puVar2 = (ulong *)operator_new__(uVar3);
  *puVar2 = uVar5;
  if ((int)this != 0) {
    this_00 = (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *)
              (puVar2 + 0x11);
    lVar4 = 0;
    do {
      array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::init
                (this_00,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,size));
      lVar4 = lVar4 + -0x90;
      this_00 = this_00 + 9;
    } while (uVar5 * -0x90 - lVar4 != 0);
  }
  return (CRuleSet *)(puVar2 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }